

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O1

void * uo_base64url_decode(void *dst,char *src,size_t src_len)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  uchar *a;
  byte *pbVar7;
  uchar *b;
  
  pbVar2 = (byte *)(src + src_len);
  if (3 < (long)src_len) {
    do {
      bVar4 = atob_url[((byte *)src)[1]];
      bVar5 = atob_url[((byte *)src)[2]];
      bVar3 = ((byte *)src)[3];
      *(byte *)dst = bVar4 >> 4 | atob_url[(byte)*src] << 2;
      *(byte *)((long)dst + 1) = bVar5 >> 2 | bVar4 << 4;
      *(byte *)((long)dst + 2) = bVar5 << 6 | atob_url[bVar3];
      dst = (void *)((long)dst + 3);
      pbVar1 = (byte *)src + 4;
      pbVar7 = (byte *)src + 8;
      src = (char *)pbVar1;
    } while (pbVar7 <= pbVar2);
  }
  lVar6 = (long)pbVar2 - (long)src;
  if (lVar6 == 2) {
    *(uchar *)dst = atob_url[((byte *)src)[1]] >> 4 | atob_url[(byte)*src] << 2;
    dst = (void *)((long)dst + 1);
  }
  else if (lVar6 == 3) {
    bVar4 = atob_url[((byte *)src)[1]];
    bVar5 = atob_url[((byte *)src)[2]];
    *(byte *)dst = bVar4 >> 4 | atob_url[(byte)*src] << 2;
    *(byte *)((long)dst + 1) = bVar5 >> 2 | bVar4 << 4;
    return (byte *)((long)dst + 2);
  }
  return dst;
}

Assistant:

void *uo_base64url_decode(
    void *dst,
    const char *src,
    size_t src_len)
{
    unsigned char *b = (unsigned char *)dst;
    const unsigned char *a = (unsigned char *)src;
    const unsigned char *end = a + src_len;
    unsigned char a0, a1, a2, a3;

    while (a + 4 <= end)
    {
        a0 = atob_url[*a++];
        a1 = atob_url[*a++];
        a2 = atob_url[*a++];
        a3 = atob_url[*a++];

        *b++ = a0 << 2 | a1 >> 4;
        *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
        *b++ = (a2 & 0x03) << 6 | a3;
    }

    switch (end - a)
    {
        case 3:
            a0 = atob_url[*a++];
            a1 = atob_url[*a++];
            a2 = atob_url[*a++];

            *b++ = a0 << 2 | a1 >> 4;
            *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
            break;

        case 2:
            a0 = atob_url[*a++];
            a1 = atob_url[*a++];

            *b++ = a0 << 2 | a1 >> 4;
            break;
    }

    return b;
}